

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O2

void __thiscall
slang::ast::ASTVisitor<hgdb::rtl::Serializer,_true,_false>::
visitDefault<slang::ast::UnpackedStructType>
          (ASTVisitor<hgdb::rtl::Serializer,_true,_false> *this,UnpackedStructType *t)

{
  iterator_range<slang::ast::Scope::iterator> iVar1;
  iterator __begin0;
  iterator local_20;
  
  iVar1 = Scope::members(&t->super_Scope);
  local_20 = iVar1.m_begin.current;
  while (local_20.current != iVar1.m_end.current.current) {
    Symbol::visit<hgdb::rtl::Serializer&>(local_20.current,(Serializer *)this);
    Scope::iterator::operator++(&local_20);
  }
  return;
}

Assistant:

void visitDefault(const T& t) {
        if constexpr (VisitExpressions && is_detected_v<visitExprs_t, T, TDerived>) {
            t.visitExprs(DERIVED);
        }

        if constexpr (VisitStatements && is_detected_v<visitStmts_t, T, TDerived>) {
            t.visitStmts(DERIVED);
        }

        if constexpr (VisitExpressions && std::is_base_of_v<Symbol, T>) {
            if (auto declaredType = t.getDeclaredType()) {
                if (auto init = declaredType->getInitializer())
                    init->visit(DERIVED);
            }
        }

        if constexpr (std::is_base_of_v<Scope, T>) {
            for (auto& member : t.members())
                member.visit(DERIVED);
        }

        if constexpr (std::is_same_v<InstanceSymbol, T>) {
            t.body.visit(DERIVED);
        }
    }